

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O1

int point_to_cbb(CBB *out,EC_GROUP *group,EC_AFFINE *point)

{
  int iVar1;
  uint8_t *in_RAX;
  size_t len;
  size_t sVar2;
  uint8_t *p;
  uint8_t *local_28;
  
  local_28 = in_RAX;
  len = ec_point_byte_len(group,POINT_CONVERSION_UNCOMPRESSED);
  if ((len != 0) && (iVar1 = CBB_add_space(out,&local_28,len), iVar1 != 0)) {
    sVar2 = ec_point_to_bytes(group,point,POINT_CONVERSION_UNCOMPRESSED,local_28,len);
    return (uint)(sVar2 == len);
  }
  return 0;
}

Assistant:

static int point_to_cbb(CBB *out, const EC_GROUP *group,
                        const EC_AFFINE *point) {
  size_t len = ec_point_byte_len(group, POINT_CONVERSION_UNCOMPRESSED);
  if (len == 0) {
    return 0;
  }
  uint8_t *p;
  return CBB_add_space(out, &p, len) &&
         ec_point_to_bytes(group, point, POINT_CONVERSION_UNCOMPRESSED, p,
                           len) == len;
}